

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceLocation __thiscall
slang::SourceManager::getExpansionLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar2;
  ulong uVar3;
  ulong uVar4;
  SourceLocation SVar5;
  
  if (((ulong)location & 0xfffffff) == 0) {
    SVar5 = (SourceLocation)0x0;
  }
  else {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    uVar4 = (ulong)(location._0_4_ & 0xfffffff);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xdd,"SourceLocation slang::SourceManager::getExpansionLoc(SourceLocation) const")
      ;
    }
    pvVar2 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       (pvVar1 + uVar4);
    SVar5 = (pvVar2->expansionRange).startLoc;
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return SVar5;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}